

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index_buffered_region.cc
# Opt level: O0

void __thiscall
S2ShapeIndexBufferedRegion::Init
          (S2ShapeIndexBufferedRegion *this,S2ShapeIndex *index,S1ChordAngle radius)

{
  S2ShapeIndex *index_00;
  Options *this_00;
  Options local_40;
  double local_28;
  S2ShapeIndex *local_20;
  S2ShapeIndex *index_local;
  S2ShapeIndexBufferedRegion *this_local;
  S1ChordAngle radius_local;
  
  (this->radius_).length2_ = radius.length2_;
  local_20 = index;
  index_local = (S2ShapeIndex *)this;
  this_local = (S2ShapeIndexBufferedRegion *)radius.length2_;
  local_28 = (double)S1ChordAngle::Successor((S1ChordAngle *)&this_local);
  index_00 = local_20;
  (this->radius_successor_).length2_ = local_28;
  memset(&local_40,0,0x18);
  S2ClosestEdgeQuery::Options::Options(&local_40);
  S2ClosestEdgeQuery::Init(&this->query_,index_00,&local_40);
  this_00 = &S2ClosestEdgeQuery::mutable_options(&this->query_)->super_Options;
  S2ClosestEdgeQueryBase<S2MinDistance>::Options::set_include_interiors(this_00,true);
  return;
}

Assistant:

void S2ShapeIndexBufferedRegion::Init(const S2ShapeIndex* index,
                                      S1ChordAngle radius) {
  radius_ = radius;
  radius_successor_ = radius.Successor();
  query_.Init(index);
  query_.mutable_options()->set_include_interiors(true);
}